

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3BtreePrevious(BtCursor *pCur,int flags)

{
  uint uVar1;
  MemPage *pMVar2;
  byte bVar3;
  ushort uVar4;
  int iVar5;
  ulong uVar6;
  
  uVar6 = (ulong)(uint)flags;
  pCur->curFlags = pCur->curFlags & 0xf1;
  (pCur->info).nSize = 0;
  if (((pCur->eState == '\0') && (pCur->ix != 0)) && (pCur->pPage->leaf != '\0')) {
    pCur->ix = pCur->ix - 1;
    return 0;
  }
  bVar3 = pCur->eState;
  if (bVar3 != 0) {
    if (2 < bVar3) {
      iVar5 = btreeRestoreCursorPosition(pCur);
      if (iVar5 != 0) {
        return iVar5;
      }
      bVar3 = pCur->eState;
    }
    if (bVar3 == 1) {
      return 0x65;
    }
    if ((bVar3 == 2) && (pCur->eState = '\0', pCur->skipNext < 0)) {
      return 0;
    }
  }
  pMVar2 = pCur->pPage;
  if ((sqlite3Config.xTestCallback == (_func_int_int *)0x0) ||
     (iVar5 = (*sqlite3Config.xTestCallback)(0x19c), iVar5 == 0)) {
    if (pMVar2->isInit != '\0') {
      uVar4 = pCur->ix;
      if (pMVar2->leaf == '\0') {
        uVar1 = *(uint *)(pMVar2->aData +
                         (CONCAT11(pMVar2->aCellIdx[(ulong)uVar4 * 2],
                                   pMVar2->aCellIdx[(ulong)uVar4 * 2 + 1]) & pMVar2->maskPage));
        iVar5 = moveToChild(pCur,uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                                 uVar1 << 0x18);
        if (iVar5 == 0) {
          iVar5 = moveToRightmost(pCur);
          return iVar5;
        }
        return iVar5;
      }
      while (uVar4 == 0) {
        if (pCur->iPage == '\0') {
          pCur->eState = '\x01';
          return 0x65;
        }
        moveToParent(pCur);
        uVar4 = pCur->ix;
      }
      pCur->ix = uVar4 - 1;
      if (pCur->pPage->intKey == '\0') {
        return 0;
      }
      if (pCur->pPage->leaf == '\0') {
        iVar5 = sqlite3BtreePrevious(pCur,(int)uVar6);
        return iVar5;
      }
      return 0;
    }
  }
  else {
    pMVar2->isInit = '\0';
  }
  sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x12d5d,
              "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
  return 0xb;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreePrevious(BtCursor *pCur, int flags){
  assert( cursorOwnsBtShared(pCur) );
  assert( flags==0 || flags==1 );
  UNUSED_PARAMETER( flags );  /* Used in COMDB2 but not native SQLite */
  pCur->curFlags &= ~(BTCF_AtLast|BTCF_ValidOvfl|BTCF_ValidNKey);
  pCur->info.nSize = 0;
  if( pCur->eState!=CURSOR_VALID
   || pCur->ix==0
   || pCur->pPage->leaf==0
  ){
    return btreePrevious(pCur);
  }
  pCur->ix--;
  return SQLITE_OK;
}